

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int ncnn::get_cpucount(void)

{
  int iVar1;
  char *pcVar2;
  char *s;
  char line [1024];
  FILE *fp;
  int count;
  char local_418 [1032];
  FILE *local_10;
  int local_8;
  int local_4;
  
  local_8 = 0;
  local_10 = fopen("/proc/cpuinfo","rb");
  if (local_10 == (FILE *)0x0) {
    local_4 = 1;
  }
  else {
    while ((iVar1 = feof(local_10), iVar1 == 0 &&
           (pcVar2 = fgets(local_418,0x400,local_10), pcVar2 != (char *)0x0))) {
      iVar1 = memcmp(local_418,"processor",9);
      if (iVar1 == 0) {
        local_8 = local_8 + 1;
      }
    }
    fclose(local_10);
    if (local_8 < 1) {
      local_8 = 1;
    }
    local_4 = local_8;
  }
  return local_4;
}

Assistant:

static int get_cpucount()
{
    int count = 0;
#ifdef __EMSCRIPTEN__
    if (emscripten_has_threading_support())
        count = emscripten_num_logical_cores();
    else
        count = 1;
#elif defined __ANDROID__ || defined __linux__
    // get cpu count from /proc/cpuinfo
    FILE* fp = fopen("/proc/cpuinfo", "rb");
    if (!fp)
        return 1;

    char line[1024];
    while (!feof(fp))
    {
        char* s = fgets(line, 1024, fp);
        if (!s)
            break;

        if (memcmp(line, "processor", 9) == 0)
        {
            count++;
        }
    }

    fclose(fp);
#elif __APPLE__
    size_t len = sizeof(count);
    sysctlbyname("hw.ncpu", &count, &len, NULL, 0);
#else
#ifdef _OPENMP
    count = omp_get_max_threads();
#else
    count = 1;
#endif // _OPENMP
#endif

    if (count < 1)
        count = 1;

    return count;
}